

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O0

void __thiscall
soplex::SPxMainSM<double>::DuplicateColsPS::execute
          (DuplicateColsPS *this,VectorBase<double> *x,VectorBase<double> *param_3,
          VectorBase<double> *param_4,VectorBase<double> *r,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *cStatus,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *rStatus,bool isOptimal)

{
  bool bVar1;
  int *piVar2;
  double *pdVar3;
  VarStatus *pVVar4;
  undefined8 uVar5;
  VarStatus VVar6;
  long *in_RDI;
  DataArray<soplex::SPxSolverBase<double>::VarStatus> *in_R9;
  double dVar7;
  VectorBase<double> *this_00;
  byte in_stack_00000010;
  double z2;
  double z1;
  double scale2;
  double scale1;
  int cIdx;
  int cIdx_new;
  int i;
  string *in_stack_fffffffffffffb38;
  int iVar9;
  double dVar8;
  SPxInternalCodeException *in_stack_fffffffffffffb40;
  Real in_stack_fffffffffffffb48;
  Real in_stack_fffffffffffffb50;
  allocator *paVar10;
  allocator local_109;
  string local_108 [38];
  undefined1 local_e2;
  allocator local_e1;
  string local_e0 [32];
  double local_c0;
  double local_b8;
  Real local_b0;
  double local_a8;
  undefined1 local_9a;
  allocator local_99;
  string local_98 [35];
  undefined1 local_75;
  allocator local_61;
  string local_60 [32];
  int local_40;
  int local_3c;
  int local_38;
  byte local_31;
  DataArray<soplex::SPxSolverBase<double>::VarStatus> *local_30;
  
  local_31 = in_stack_00000010 & 1;
  if ((*(byte *)(in_RDI + 0xb) & 1) != 0) {
    return;
  }
  local_30 = in_R9;
  if ((*(byte *)((long)in_RDI + 0x59) & 1) != 0) {
    local_38 = DataArray<int>::size((DataArray<int> *)(in_RDI + 0xc));
    while (local_38 = local_38 + -1, -1 < local_38) {
      piVar2 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0xc),local_38);
      if (-1 < *piVar2) {
        piVar2 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0xc),local_38);
        local_3c = *piVar2;
        local_40 = local_38;
        pdVar3 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffb40,
                            (int)((ulong)in_stack_fffffffffffffb38 >> 0x20));
        dVar8 = *pdVar3;
        pdVar3 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffb40,
                            (int)((ulong)in_stack_fffffffffffffb38 >> 0x20));
        *pdVar3 = dVar8;
        pdVar3 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffb40,
                            (int)((ulong)in_stack_fffffffffffffb38 >> 0x20));
        dVar8 = *pdVar3;
        pdVar3 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffb40,
                            (int)((ulong)in_stack_fffffffffffffb38 >> 0x20));
        *pdVar3 = dVar8;
        pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[](local_30,local_3c);
        VVar6 = *pVVar4;
        pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[](local_30,local_40);
        *pVVar4 = VVar6;
      }
    }
    return;
  }
  pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                     (in_R9,*(int *)((long)in_RDI + 0x2c));
  if (*pVVar4 == ON_LOWER) {
    dVar8 = (double)in_RDI[8];
    pdVar3 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_fffffffffffffb40,
                        (int)((ulong)in_stack_fffffffffffffb38 >> 0x20));
    *pdVar3 = dVar8;
    iVar9 = (int)((ulong)in_stack_fffffffffffffb38 >> 0x20);
    if ((double)in_RDI[10] <= 0.0) {
      dVar8 = (double)in_RDI[7];
      pdVar3 = VectorBase<double>::operator[]((VectorBase<double> *)in_stack_fffffffffffffb40,iVar9)
      ;
      *pdVar3 = dVar8;
      VVar6 = ON_UPPER;
      if ((double)in_RDI[6] == (double)in_RDI[7]) {
        VVar6 = FIXED;
      }
      pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                         (local_30,(int)in_RDI[5]);
      *pVVar4 = VVar6;
    }
    else {
      dVar8 = (double)in_RDI[6];
      pdVar3 = VectorBase<double>::operator[]((VectorBase<double> *)in_stack_fffffffffffffb40,iVar9)
      ;
      *pdVar3 = dVar8;
      VVar6 = ON_LOWER;
      if ((double)in_RDI[6] == (double)in_RDI[7]) {
        VVar6 = FIXED;
      }
      pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                         (local_30,(int)in_RDI[5]);
      *pVVar4 = VVar6;
    }
    goto LAB_002957c2;
  }
  pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                     (local_30,*(int *)((long)in_RDI + 0x2c));
  if (*pVVar4 == ON_UPPER) {
    dVar8 = (double)in_RDI[9];
    pdVar3 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_fffffffffffffb40,
                        (int)((ulong)in_stack_fffffffffffffb38 >> 0x20));
    *pdVar3 = dVar8;
    iVar9 = (int)((ulong)in_stack_fffffffffffffb38 >> 0x20);
    if ((double)in_RDI[10] <= 0.0) {
      dVar8 = (double)in_RDI[6];
      pdVar3 = VectorBase<double>::operator[]((VectorBase<double> *)in_stack_fffffffffffffb40,iVar9)
      ;
      *pdVar3 = dVar8;
      VVar6 = ON_LOWER;
      if ((double)in_RDI[6] == (double)in_RDI[7]) {
        VVar6 = FIXED;
      }
      pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                         (local_30,(int)in_RDI[5]);
      *pVVar4 = VVar6;
    }
    else {
      dVar8 = (double)in_RDI[7];
      pdVar3 = VectorBase<double>::operator[]((VectorBase<double> *)in_stack_fffffffffffffb40,iVar9)
      ;
      *pdVar3 = dVar8;
      VVar6 = ON_UPPER;
      if ((double)in_RDI[6] == (double)in_RDI[7]) {
        VVar6 = FIXED;
      }
      pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                         (local_30,(int)in_RDI[5]);
      *pVVar4 = VVar6;
    }
    goto LAB_002957c2;
  }
  pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                     (local_30,*(int *)((long)in_RDI + 0x2c));
  if (*pVVar4 == FIXED) {
    dVar8 = (double)in_RDI[6];
    pdVar3 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_fffffffffffffb40,
                        (int)((ulong)in_stack_fffffffffffffb38 >> 0x20));
    *pdVar3 = dVar8;
    pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                       (local_30,(int)in_RDI[5]);
    *pVVar4 = FIXED;
    goto LAB_002957c2;
  }
  pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                     (local_30,*(int *)((long)in_RDI + 0x2c));
  if (*pVVar4 != ZERO) {
    pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                       (local_30,*(int *)((long)in_RDI + 0x2c));
    if (*pVVar4 == BASIC) {
      VectorBase<double>::operator[]
                ((VectorBase<double> *)in_stack_fffffffffffffb40,
                 (int)((ulong)in_stack_fffffffffffffb38 >> 0x20));
      local_a8 = maxAbs(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
      VectorBase<double>::operator[]
                ((VectorBase<double> *)in_stack_fffffffffffffb40,
                 (int)((ulong)in_stack_fffffffffffffb38 >> 0x20));
      local_b0 = maxAbs(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
      if (local_a8 < 1.0) {
        local_a8 = 1.0;
      }
      if (local_b0 < 1.0) {
        local_b0 = 1.0;
      }
      pdVar3 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffb40,
                          (int)((ulong)in_stack_fffffffffffffb38 >> 0x20));
      local_b8 = *pdVar3 / local_a8 - (double)in_RDI[8] / local_a8;
      pdVar3 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffb40,
                          (int)((ulong)in_stack_fffffffffffffb38 >> 0x20));
      local_c0 = *pdVar3 / local_b0 - (double)in_RDI[9] / local_b0;
      (**(code **)(*in_RDI + 0x38))();
      bVar1 = isZero<double,double>
                        ((double)in_stack_fffffffffffffb40,(double)in_stack_fffffffffffffb38);
      if (bVar1) {
        local_b8 = 0.0;
      }
      (**(code **)(*in_RDI + 0x38))();
      bVar1 = isZero<double,double>
                        ((double)in_stack_fffffffffffffb40,(double)in_stack_fffffffffffffb38);
      if (bVar1) {
        local_c0 = 0.0;
      }
      dVar8 = (double)in_RDI[6];
      pdVar3 = (double *)infinity();
      if ((((-*pdVar3 < dVar8) ||
           (dVar8 = (double)in_RDI[7], pdVar3 = (double *)infinity(), dVar8 < *pdVar3)) ||
          (dVar8 = (double)in_RDI[8], pdVar3 = (double *)infinity(), -*pdVar3 < dVar8)) ||
         (dVar8 = (double)in_RDI[9], pdVar3 = (double *)infinity(), dVar8 < *pdVar3)) {
        iVar9 = (int)((ulong)in_stack_fffffffffffffb38 >> 0x20);
        if ((double)in_RDI[10] <= 0.0) {
          VectorBase<double>::operator[]((VectorBase<double> *)in_stack_fffffffffffffb40,iVar9);
          (**(code **)(*in_RDI + 0x38))();
          bVar1 = GErel<double,double,double>
                            ((double)in_stack_fffffffffffffb40,(double)in_stack_fffffffffffffb38,
                             1.33742631604498e-317);
          if (bVar1) {
            VVar6 = ON_LOWER;
            if ((double)in_RDI[6] == (double)in_RDI[7]) {
              VVar6 = FIXED;
            }
            pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                               (local_30,(int)in_RDI[5]);
            *pVVar4 = VVar6;
            dVar8 = (double)in_RDI[6];
            iVar9 = (int)((ulong)in_stack_fffffffffffffb38 >> 0x20);
            pdVar3 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_fffffffffffffb40,iVar9);
            *pdVar3 = dVar8;
            dVar8 = (double)in_RDI[10];
            pdVar3 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_fffffffffffffb40,iVar9);
            dVar7 = *pdVar3;
            pdVar3 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_fffffffffffffb40,iVar9);
            *pdVar3 = *pdVar3 - dVar8 * dVar7;
          }
          else {
            VectorBase<double>::operator[]
                      ((VectorBase<double> *)in_stack_fffffffffffffb40,
                       (int)((ulong)in_stack_fffffffffffffb38 >> 0x20));
            (**(code **)(*in_RDI + 0x38))();
            bVar1 = GErel<double,double,double>
                              ((double)in_stack_fffffffffffffb40,(double)in_stack_fffffffffffffb38,
                               1.33760516780878e-317);
            if ((!bVar1) ||
               (dVar8 = (double)in_RDI[6], pdVar3 = (double *)infinity(), dVar8 <= -*pdVar3)) {
              VectorBase<double>::operator[]
                        ((VectorBase<double> *)in_stack_fffffffffffffb40,
                         (int)((ulong)in_stack_fffffffffffffb38 >> 0x20));
              (**(code **)(*in_RDI + 0x38))();
              bVar1 = GErel<double,double,double>
                                ((double)in_stack_fffffffffffffb40,(double)in_stack_fffffffffffffb38
                                 ,1.33782008636472e-317);
              if ((!bVar1) ||
                 (dVar8 = (double)in_RDI[9], pdVar3 = (double *)infinity(), *pdVar3 <= dVar8)) {
                VectorBase<double>::operator[]
                          ((VectorBase<double> *)in_stack_fffffffffffffb40,
                           (int)((ulong)in_stack_fffffffffffffb38 >> 0x20));
                (**(code **)(*in_RDI + 0x38))();
                bVar1 = GErel<double,double,double>
                                  ((double)in_stack_fffffffffffffb40,
                                   (double)in_stack_fffffffffffffb38,1.33801919481999e-317);
                if ((!bVar1) ||
                   (dVar8 = (double)in_RDI[7], pdVar3 = (double *)infinity(), *pdVar3 <= dVar8)) {
                  VectorBase<double>::operator[]
                            ((VectorBase<double> *)in_stack_fffffffffffffb40,
                             (int)((ulong)in_stack_fffffffffffffb38 >> 0x20));
                  (**(code **)(*in_RDI + 0x38))();
                  bVar1 = GErel<double,double,double>
                                    ((double)in_stack_fffffffffffffb40,
                                     (double)in_stack_fffffffffffffb38,1.33821533888139e-317);
                  if ((!bVar1) ||
                     (dVar8 = (double)in_RDI[8], pdVar3 = (double *)infinity(), dVar8 <= -*pdVar3))
                  {
                    VectorBase<double>::operator[]
                              ((VectorBase<double> *)in_stack_fffffffffffffb40,
                               (int)((ulong)in_stack_fffffffffffffb38 >> 0x20));
                    (**(code **)(*in_RDI + 0x38))();
                    bVar1 = LTrel<double,double,double>
                                      ((double)in_stack_fffffffffffffb40,
                                       (double)in_stack_fffffffffffffb38,1.33840950668021e-317);
                    if (!bVar1) {
                      uVar5 = __cxa_allocate_exception(0x28);
                      paVar10 = &local_109;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string
                                (local_108,"XMAISM09 This should never happen.",paVar10);
                      SPxInternalCodeException::SPxInternalCodeException
                                (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
                      __cxa_throw(uVar5,&SPxInternalCodeException::typeinfo,
                                  SPxInternalCodeException::~SPxInternalCodeException);
                    }
                    VVar6 = ON_UPPER;
                    if ((double)in_RDI[6] == (double)in_RDI[7]) {
                      VVar6 = FIXED;
                    }
                    pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                                       (local_30,(int)in_RDI[5]);
                    *pVVar4 = VVar6;
                    dVar8 = (double)in_RDI[7];
                    iVar9 = (int)((ulong)in_stack_fffffffffffffb38 >> 0x20);
                    pdVar3 = VectorBase<double>::operator[]
                                       ((VectorBase<double> *)in_stack_fffffffffffffb40,iVar9);
                    *pdVar3 = dVar8;
                    dVar8 = (double)in_RDI[10];
                    pdVar3 = VectorBase<double>::operator[]
                                       ((VectorBase<double> *)in_stack_fffffffffffffb40,iVar9);
                    dVar7 = *pdVar3;
                    pdVar3 = VectorBase<double>::operator[]
                                       ((VectorBase<double> *)in_stack_fffffffffffffb40,iVar9);
                    *pdVar3 = *pdVar3 - dVar8 * dVar7;
                  }
                  else {
                    VVar6 = ON_LOWER;
                    if ((double)in_RDI[8] == (double)in_RDI[9]) {
                      VVar6 = FIXED;
                    }
                    pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                                       (local_30,*(int *)((long)in_RDI + 0x2c));
                    *pVVar4 = VVar6;
                    dVar8 = (double)in_RDI[8];
                    iVar9 = (int)((ulong)in_stack_fffffffffffffb38 >> 0x20);
                    pdVar3 = VectorBase<double>::operator[]
                                       ((VectorBase<double> *)in_stack_fffffffffffffb40,iVar9);
                    *pdVar3 = dVar8;
                    pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                                       (local_30,(int)in_RDI[5]);
                    *pVVar4 = BASIC;
                    dVar7 = local_b8 * local_a8;
                    dVar8 = (double)in_RDI[10];
                    pdVar3 = VectorBase<double>::operator[]
                                       ((VectorBase<double> *)in_stack_fffffffffffffb40,iVar9);
                    *pdVar3 = dVar7 / dVar8;
                  }
                }
                else {
                  VVar6 = ON_UPPER;
                  if ((double)in_RDI[6] == (double)in_RDI[7]) {
                    VVar6 = FIXED;
                  }
                  pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                                     (local_30,(int)in_RDI[5]);
                  *pVVar4 = VVar6;
                  dVar8 = (double)in_RDI[7];
                  iVar9 = (int)((ulong)in_stack_fffffffffffffb38 >> 0x20);
                  pdVar3 = VectorBase<double>::operator[]
                                     ((VectorBase<double> *)in_stack_fffffffffffffb40,iVar9);
                  *pdVar3 = dVar8;
                  dVar8 = (double)in_RDI[10];
                  pdVar3 = VectorBase<double>::operator[]
                                     ((VectorBase<double> *)in_stack_fffffffffffffb40,iVar9);
                  dVar7 = *pdVar3;
                  pdVar3 = VectorBase<double>::operator[]
                                     ((VectorBase<double> *)in_stack_fffffffffffffb40,iVar9);
                  *pdVar3 = *pdVar3 - dVar8 * dVar7;
                }
              }
              else {
                VVar6 = ON_UPPER;
                if ((double)in_RDI[8] == (double)in_RDI[9]) {
                  VVar6 = FIXED;
                }
                pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                                   (local_30,*(int *)((long)in_RDI + 0x2c));
                *pVVar4 = VVar6;
                dVar8 = (double)in_RDI[9];
                iVar9 = (int)((ulong)in_stack_fffffffffffffb38 >> 0x20);
                pdVar3 = VectorBase<double>::operator[]
                                   ((VectorBase<double> *)in_stack_fffffffffffffb40,iVar9);
                *pdVar3 = dVar8;
                pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                                   (local_30,(int)in_RDI[5]);
                *pVVar4 = BASIC;
                dVar7 = local_c0 * local_b0;
                dVar8 = (double)in_RDI[10];
                pdVar3 = VectorBase<double>::operator[]
                                   ((VectorBase<double> *)in_stack_fffffffffffffb40,iVar9);
                *pdVar3 = dVar7 / dVar8;
              }
            }
            else {
              VVar6 = ON_LOWER;
              if ((double)in_RDI[6] == (double)in_RDI[7]) {
                VVar6 = FIXED;
              }
              pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                                 (local_30,(int)in_RDI[5]);
              *pVVar4 = VVar6;
              dVar8 = (double)in_RDI[6];
              iVar9 = (int)((ulong)in_stack_fffffffffffffb38 >> 0x20);
              pdVar3 = VectorBase<double>::operator[]
                                 ((VectorBase<double> *)in_stack_fffffffffffffb40,iVar9);
              *pdVar3 = dVar8;
              dVar8 = (double)in_RDI[10];
              pdVar3 = VectorBase<double>::operator[]
                                 ((VectorBase<double> *)in_stack_fffffffffffffb40,iVar9);
              dVar7 = *pdVar3;
              pdVar3 = VectorBase<double>::operator[]
                                 ((VectorBase<double> *)in_stack_fffffffffffffb40,iVar9);
              *pdVar3 = *pdVar3 - dVar8 * dVar7;
            }
          }
        }
        else {
          VectorBase<double>::operator[]((VectorBase<double> *)in_stack_fffffffffffffb40,iVar9);
          (**(code **)(*in_RDI + 0x38))();
          bVar1 = GErel<double,double,double>
                            ((double)in_stack_fffffffffffffb40,(double)in_stack_fffffffffffffb38,
                             1.3361170420835e-317);
          if (bVar1) {
            VVar6 = ON_UPPER;
            if ((double)in_RDI[6] == (double)in_RDI[7]) {
              VVar6 = FIXED;
            }
            pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                               (local_30,(int)in_RDI[5]);
            *pVVar4 = VVar6;
            dVar8 = (double)in_RDI[7];
            iVar9 = (int)((ulong)in_stack_fffffffffffffb38 >> 0x20);
            pdVar3 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_fffffffffffffb40,iVar9);
            *pdVar3 = dVar8;
            dVar8 = (double)in_RDI[10];
            pdVar3 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_fffffffffffffb40,iVar9);
            dVar7 = *pdVar3;
            pdVar3 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_fffffffffffffb40,iVar9);
            *pdVar3 = *pdVar3 - dVar8 * dVar7;
          }
          else {
            VectorBase<double>::operator[]
                      ((VectorBase<double> *)in_stack_fffffffffffffb40,
                       (int)((ulong)in_stack_fffffffffffffb38 >> 0x20));
            (**(code **)(*in_RDI + 0x38))();
            bVar1 = GErel<double,double,double>
                              ((double)in_stack_fffffffffffffb40,(double)in_stack_fffffffffffffb38,
                               1.33629441165036e-317);
            if ((!bVar1) ||
               (dVar8 = (double)in_RDI[7], pdVar3 = (double *)infinity(), *pdVar3 <= dVar8)) {
              VectorBase<double>::operator[]
                        ((VectorBase<double> *)in_stack_fffffffffffffb40,
                         (int)((ulong)in_stack_fffffffffffffb38 >> 0x20));
              (**(code **)(*in_RDI + 0x38))();
              bVar1 = GErel<double,double,double>
                                ((double)in_stack_fffffffffffffb40,(double)in_stack_fffffffffffffb38
                                 ,1.33649648449951e-317);
              if ((!bVar1) ||
                 (dVar8 = (double)in_RDI[9], pdVar3 = (double *)infinity(), *pdVar3 <= dVar8)) {
                VectorBase<double>::operator[]
                          ((VectorBase<double> *)in_stack_fffffffffffffb40,
                           (int)((ulong)in_stack_fffffffffffffb38 >> 0x20));
                (**(code **)(*in_RDI + 0x38))();
                bVar1 = GErel<double,double,double>
                                  ((double)in_stack_fffffffffffffb40,
                                   (double)in_stack_fffffffffffffb38,1.33669559295478e-317);
                if ((!bVar1) ||
                   (dVar8 = (double)in_RDI[6], pdVar3 = (double *)infinity(), dVar8 <= -*pdVar3)) {
                  VectorBase<double>::operator[]
                            ((VectorBase<double> *)in_stack_fffffffffffffb40,
                             (int)((ulong)in_stack_fffffffffffffb38 >> 0x20));
                  (**(code **)(*in_RDI + 0x38))();
                  bVar1 = GErel<double,double,double>
                                    ((double)in_stack_fffffffffffffb40,
                                     (double)in_stack_fffffffffffffb38,1.33691051151073e-317);
                  if ((!bVar1) ||
                     (dVar8 = (double)in_RDI[8], pdVar3 = (double *)infinity(), dVar8 <= -*pdVar3))
                  {
                    VectorBase<double>::operator[]
                              ((VectorBase<double> *)in_stack_fffffffffffffb40,
                               (int)((ulong)in_stack_fffffffffffffb38 >> 0x20));
                    (**(code **)(*in_RDI + 0x38))();
                    bVar1 = LTrel<double,double,double>
                                      ((double)in_stack_fffffffffffffb40,
                                       (double)in_stack_fffffffffffffb38,1.33712246567279e-317);
                    if (!bVar1) {
                      local_e2 = 1;
                      uVar5 = __cxa_allocate_exception(0x28);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string
                                (local_e0,"XMAISM08 This should never happen.",&local_e1);
                      SPxInternalCodeException::SPxInternalCodeException
                                (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
                      local_e2 = 0;
                      __cxa_throw(uVar5,&SPxInternalCodeException::typeinfo,
                                  SPxInternalCodeException::~SPxInternalCodeException);
                    }
                    VVar6 = ON_LOWER;
                    if ((double)in_RDI[6] == (double)in_RDI[7]) {
                      VVar6 = FIXED;
                    }
                    pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                                       (local_30,(int)in_RDI[5]);
                    *pVVar4 = VVar6;
                    dVar8 = (double)in_RDI[6];
                    iVar9 = (int)((ulong)in_stack_fffffffffffffb38 >> 0x20);
                    pdVar3 = VectorBase<double>::operator[]
                                       ((VectorBase<double> *)in_stack_fffffffffffffb40,iVar9);
                    *pdVar3 = dVar8;
                    dVar8 = (double)in_RDI[10];
                    pdVar3 = VectorBase<double>::operator[]
                                       ((VectorBase<double> *)in_stack_fffffffffffffb40,iVar9);
                    dVar7 = *pdVar3;
                    pdVar3 = VectorBase<double>::operator[]
                                       ((VectorBase<double> *)in_stack_fffffffffffffb40,iVar9);
                    *pdVar3 = *pdVar3 - dVar8 * dVar7;
                  }
                  else {
                    VVar6 = ON_LOWER;
                    if ((double)in_RDI[8] == (double)in_RDI[9]) {
                      VVar6 = FIXED;
                    }
                    pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                                       (local_30,*(int *)((long)in_RDI + 0x2c));
                    *pVVar4 = VVar6;
                    dVar8 = (double)in_RDI[8];
                    iVar9 = (int)((ulong)in_stack_fffffffffffffb38 >> 0x20);
                    pdVar3 = VectorBase<double>::operator[]
                                       ((VectorBase<double> *)in_stack_fffffffffffffb40,iVar9);
                    *pdVar3 = dVar8;
                    pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                                       (local_30,(int)in_RDI[5]);
                    *pVVar4 = BASIC;
                    dVar7 = local_b8 * local_a8;
                    dVar8 = (double)in_RDI[10];
                    pdVar3 = VectorBase<double>::operator[]
                                       ((VectorBase<double> *)in_stack_fffffffffffffb40,iVar9);
                    *pdVar3 = dVar7 / dVar8;
                  }
                }
                else {
                  VVar6 = ON_LOWER;
                  if ((double)in_RDI[6] == (double)in_RDI[7]) {
                    VVar6 = FIXED;
                  }
                  pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                                     (local_30,(int)in_RDI[5]);
                  *pVVar4 = VVar6;
                  dVar8 = (double)in_RDI[6];
                  iVar9 = (int)((ulong)in_stack_fffffffffffffb38 >> 0x20);
                  pdVar3 = VectorBase<double>::operator[]
                                     ((VectorBase<double> *)in_stack_fffffffffffffb40,iVar9);
                  *pdVar3 = dVar8;
                  dVar8 = (double)in_RDI[10];
                  pdVar3 = VectorBase<double>::operator[]
                                     ((VectorBase<double> *)in_stack_fffffffffffffb40,iVar9);
                  dVar7 = *pdVar3;
                  pdVar3 = VectorBase<double>::operator[]
                                     ((VectorBase<double> *)in_stack_fffffffffffffb40,iVar9);
                  *pdVar3 = *pdVar3 - dVar8 * dVar7;
                }
              }
              else {
                VVar6 = ON_UPPER;
                if ((double)in_RDI[8] == (double)in_RDI[9]) {
                  VVar6 = FIXED;
                }
                pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                                   (local_30,*(int *)((long)in_RDI + 0x2c));
                *pVVar4 = VVar6;
                dVar8 = (double)in_RDI[9];
                iVar9 = (int)((ulong)in_stack_fffffffffffffb38 >> 0x20);
                pdVar3 = VectorBase<double>::operator[]
                                   ((VectorBase<double> *)in_stack_fffffffffffffb40,iVar9);
                *pdVar3 = dVar8;
                pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                                   (local_30,(int)in_RDI[5]);
                *pVVar4 = BASIC;
                dVar7 = local_c0 * local_b0;
                dVar8 = (double)in_RDI[10];
                pdVar3 = VectorBase<double>::operator[]
                                   ((VectorBase<double> *)in_stack_fffffffffffffb40,iVar9);
                *pdVar3 = dVar7 / dVar8;
              }
            }
            else {
              VVar6 = ON_UPPER;
              if ((double)in_RDI[6] == (double)in_RDI[7]) {
                VVar6 = FIXED;
              }
              pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                                 (local_30,(int)in_RDI[5]);
              *pVVar4 = VVar6;
              dVar8 = (double)in_RDI[7];
              iVar9 = (int)((ulong)in_stack_fffffffffffffb38 >> 0x20);
              pdVar3 = VectorBase<double>::operator[]
                                 ((VectorBase<double> *)in_stack_fffffffffffffb40,iVar9);
              *pdVar3 = dVar8;
              dVar8 = (double)in_RDI[10];
              pdVar3 = VectorBase<double>::operator[]
                                 ((VectorBase<double> *)in_stack_fffffffffffffb40,iVar9);
              dVar7 = *pdVar3;
              pdVar3 = VectorBase<double>::operator[]
                                 ((VectorBase<double> *)in_stack_fffffffffffffb40,iVar9);
              *pdVar3 = *pdVar3 - dVar8 * dVar7;
            }
          }
        }
      }
      else {
        pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                           (local_30,(int)in_RDI[5]);
        *pVVar4 = ZERO;
        pdVar3 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffb40,
                            (int)((ulong)in_stack_fffffffffffffb38 >> 0x20));
        *pdVar3 = 0.0;
      }
    }
    goto LAB_002957c2;
  }
  (**(code **)(*in_RDI + 0x38))();
  bVar1 = isZero<double,double>((double)in_stack_fffffffffffffb40,(double)in_stack_fffffffffffffb38)
  ;
  if (bVar1) {
    (**(code **)(*in_RDI + 0x38))();
    bVar1 = isZero<double,double>
                      ((double)in_stack_fffffffffffffb40,(double)in_stack_fffffffffffffb38);
    if (((!bVar1) || ((double)in_RDI[8] != (double)in_RDI[9])) ||
       (NAN((double)in_RDI[8]) || NAN((double)in_RDI[9]))) goto LAB_00293b16;
    pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                       (local_30,*(int *)((long)in_RDI + 0x2c));
    *pVVar4 = FIXED;
  }
  else {
LAB_00293b16:
    (**(code **)(*in_RDI + 0x38))();
    bVar1 = isZero<double,double>
                      ((double)in_stack_fffffffffffffb40,(double)in_stack_fffffffffffffb38);
    if (bVar1) {
      pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                         (local_30,*(int *)((long)in_RDI + 0x2c));
      *pVVar4 = ON_LOWER;
    }
    else {
      (**(code **)(*in_RDI + 0x38))();
      bVar1 = isZero<double,double>
                        ((double)in_stack_fffffffffffffb40,(double)in_stack_fffffffffffffb38);
      if (bVar1) {
        pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                           (local_30,*(int *)((long)in_RDI + 0x2c));
        *pVVar4 = ON_UPPER;
      }
      else {
        (**(code **)(*in_RDI + 0x38))();
        bVar1 = LErel<double,double,double>
                          ((double)in_stack_fffffffffffffb40,(double)in_stack_fffffffffffffb38,
                           1.33512446420101e-317);
        if (!bVar1) {
LAB_00293c51:
          local_75 = 1;
          uVar5 = __cxa_allocate_exception(0x28);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_60,"XMAISM05 This should never happen.",&local_61);
          SPxInternalCodeException::SPxInternalCodeException
                    (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
          local_75 = 0;
          __cxa_throw(uVar5,&SPxInternalCodeException::typeinfo,
                      SPxInternalCodeException::~SPxInternalCodeException);
        }
        (**(code **)(*in_RDI + 0x38))();
        bVar1 = GErel<double,double,double>
                          ((double)in_stack_fffffffffffffb40,(double)in_stack_fffffffffffffb38,
                           1.33515114374588e-317);
        if (!bVar1) goto LAB_00293c51;
        pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                           (local_30,*(int *)((long)in_RDI + 0x2c));
        *pVVar4 = ZERO;
      }
    }
  }
  pdVar3 = VectorBase<double>::operator[]
                     ((VectorBase<double> *)in_stack_fffffffffffffb40,
                      (int)((ulong)in_stack_fffffffffffffb38 >> 0x20));
  *pdVar3 = 0.0;
  (**(code **)(*in_RDI + 0x38))();
  bVar1 = isZero<double,double>((double)in_stack_fffffffffffffb40,(double)in_stack_fffffffffffffb38)
  ;
  if (bVar1) {
    (**(code **)(*in_RDI + 0x38))();
    bVar1 = isZero<double,double>
                      ((double)in_stack_fffffffffffffb40,(double)in_stack_fffffffffffffb38);
    if (bVar1) {
      if (((double)in_RDI[6] == (double)in_RDI[7]) &&
         (!NAN((double)in_RDI[6]) && !NAN((double)in_RDI[7]))) {
        pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                           (local_30,(int)in_RDI[5]);
        *pVVar4 = FIXED;
        goto LAB_002957c2;
      }
    }
  }
  (**(code **)(*in_RDI + 0x38))();
  bVar1 = isZero<double,double>((double)in_stack_fffffffffffffb40,(double)in_stack_fffffffffffffb38)
  ;
  if (bVar1) {
    pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                       (local_30,(int)in_RDI[5]);
    *pVVar4 = ON_LOWER;
  }
  else {
    (**(code **)(*in_RDI + 0x38))();
    bVar1 = isZero<double,double>
                      ((double)in_stack_fffffffffffffb40,(double)in_stack_fffffffffffffb38);
    if (!bVar1) {
      (**(code **)(*in_RDI + 0x38))();
      bVar1 = LErel<double,double,double>
                        ((double)in_stack_fffffffffffffb40,(double)in_stack_fffffffffffffb38,
                         1.33549451936974e-317);
      if (bVar1) {
        (**(code **)(*in_RDI + 0x38))();
        bVar1 = GErel<double,double,double>
                          ((double)in_stack_fffffffffffffb40,(double)in_stack_fffffffffffffb38,
                           1.33552119891462e-317);
        if (bVar1) {
          pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                             (local_30,(int)in_RDI[5]);
          *pVVar4 = ZERO;
          goto LAB_002957c2;
        }
      }
      local_9a = 1;
      uVar5 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_98,"XMAISM06 This should never happen.",&local_99);
      SPxInternalCodeException::SPxInternalCodeException
                (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
      local_9a = 0;
      __cxa_throw(uVar5,&SPxInternalCodeException::typeinfo,
                  SPxInternalCodeException::~SPxInternalCodeException);
    }
    pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                       (local_30,(int)in_RDI[5]);
    *pVVar4 = ON_UPPER;
  }
LAB_002957c2:
  dVar8 = (double)in_RDI[10];
  pdVar3 = VectorBase<double>::operator[]
                     ((VectorBase<double> *)in_stack_fffffffffffffb40,(int)((ulong)dVar8 >> 0x20));
  this_00 = (VectorBase<double> *)(dVar8 * *pdVar3);
  pdVar3 = VectorBase<double>::operator[](this_00,(int)((ulong)dVar8 >> 0x20));
  *pdVar3 = (double)this_00;
  return;
}

Assistant:

void SPxMainSM<R>::DuplicateColsPS::execute(VectorBase<R>& x,
      VectorBase<R>&,
      VectorBase<R>&,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{

   if(m_isFirst)
   {
#ifdef SOPLEX_CHECK_BASIS_DIM

      if(!this->checkBasisDim(rStatus, cStatus))
      {
         throw SPxInternalCodeException("XMAISM25 Dimension doesn't match after this step.");
      }

#endif
      return;
   }


   // correcting the change of idx by deletion of the columns:
   if(m_isLast)
   {
      for(int i = m_perm.size() - 1; i >= 0; --i)
      {
         if(m_perm[i] >= 0)
         {
            int cIdx_new = m_perm[i];
            int cIdx = i;
            x[cIdx] = x[cIdx_new];
            r[cIdx] = r[cIdx_new];
            cStatus[cIdx] = cStatus[cIdx_new];
         }
      }

      return;
   }

   // primal & basis:
   SOPLEX_ASSERT_WARN("WMAISM03", isNotZero(m_scale, this->epsilon()));

   if(cStatus[m_k] == SPxSolverBase<R>::ON_LOWER)
   {
      x[m_k] = m_loK;

      if(m_scale > 0)
      {
         x[m_j]       = m_loJ;
         cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
      }
      else
      {
         x[m_j]       = m_upJ;
         cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
      }
   }
   else if(cStatus[m_k] == SPxSolverBase<R>::ON_UPPER)
   {
      x[m_k] = m_upK;

      if(m_scale > 0)
      {
         x[m_j]       = m_upJ;
         cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
      }
      else
      {
         x[m_j]       = m_loJ;
         cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
      }
   }
   else if(cStatus[m_k] == SPxSolverBase<R>::FIXED)
   {
      // => x[m_k] and x[m_j] are also fixed before the corresponding preprocessing step
      x[m_j]       = m_loJ;
      cStatus[m_j] = SPxSolverBase<R>::FIXED;
   }
   else if(cStatus[m_k] == SPxSolverBase<R>::ZERO)
   {
      /* we only aggregate duplicate columns if 0 is contained in their bounds, so we can handle this case properly */
      assert(isZero(x[m_k], this->epsilon()));
      assert(LErel(m_loJ, R(0.0), this->epsilon()));
      assert(GErel(m_upJ, R(0.0), this->epsilon()));
      assert(LErel(m_loK, R(0.0), this->epsilon()));
      assert(GErel(m_upK, R(0.0), this->epsilon()));

      if(isZero(m_loK, this->epsilon()) && isZero(m_upK, this->epsilon()) && m_loK == m_upK)
         cStatus[m_k] = SPxSolverBase<R>::FIXED;
      else if(isZero(m_loK, this->epsilon()))
         cStatus[m_k] = SPxSolverBase<R>::ON_LOWER;
      else if(isZero(m_upK, this->epsilon()))
         cStatus[m_k] = SPxSolverBase<R>::ON_UPPER;
      else if(LErel(m_loK, R(0.0), this->epsilon()) && GErel(m_upK, R(0.0), this->epsilon()))
         cStatus[m_k] = SPxSolverBase<R>::ZERO;
      else
         throw SPxInternalCodeException("XMAISM05 This should never happen.");

      x[m_j] = 0.0;

      if(isZero(m_loJ, this->epsilon()) && isZero(m_upJ, this->epsilon()) && m_loJ == m_upJ)
         cStatus[m_j] = SPxSolverBase<R>::FIXED;
      else if(isZero(m_loJ, this->epsilon()))
         cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
      else if(isZero(m_upJ, this->epsilon()))
         cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      else if(LErel(m_loJ, R(0.0), this->epsilon()) && GErel(m_upJ, R(0.0), this->epsilon()))
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
      else
         throw SPxInternalCodeException("XMAISM06 This should never happen.");
   }
   else if(cStatus[m_k] == SPxSolverBase<R>::BASIC)
   {
      R scale1 = maxAbs(x[m_k], m_loK);
      R scale2 = maxAbs(x[m_k], m_upK);

      if(scale1 < 1.0)
         scale1 = 1.0;

      if(scale2 < 1.0)
         scale2 = 1.0;

      R z1 = (x[m_k] / scale1) - (m_loK / scale1);
      R z2 = (x[m_k] / scale2) - (m_upK / scale2);

      if(isZero(z1, this->epsilon()))
         z1 = 0.0;

      if(isZero(z2, this->epsilon()))
         z2 = 0.0;

      if(m_loJ <= R(-infinity) && m_upJ >= R(infinity) && m_loK <= R(-infinity) && m_upK >= R(infinity))
      {
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
         x[m_j] = 0.0;
      }
      else if(m_scale > 0.0)
      {
         if(GErel(x[m_k], m_upK + m_scale * m_upJ, this->epsilon()))
         {
            assert(m_upJ < R(infinity));
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_j] = m_upJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_upJ, this->epsilon()) && m_upJ < R(infinity))
         {
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_j] = m_upJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_upK + m_scale * m_loJ, this->epsilon()) && m_upK < R(infinity))
         {
            cStatus[m_k] = (m_loK == m_upK) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_k] = m_upK;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            x[m_j] = z2 * scale2 / m_scale;
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_loJ, this->epsilon()) && m_loJ > R(-infinity))
         {
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_j] = m_loJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_loJ, this->epsilon()) && m_loK > R(-infinity))
         {
            cStatus[m_k] = (m_loK == m_upK) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_k] = m_loK;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            x[m_j] = z1 * scale1 / m_scale;
         }
         else if(LTrel(x[m_k], m_loK + m_scale * m_loJ, this->epsilon()))
         {
            assert(m_loJ > R(-infinity));
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_j] = m_loJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else
         {
            throw SPxInternalCodeException("XMAISM08 This should never happen.");
         }
      }
      else
      {
         assert(m_scale < 0.0);

         if(GErel(x[m_k], m_upK + m_scale * m_loJ, this->epsilon()))
         {
            assert(m_loJ > R(-infinity));
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_j] = m_loJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_loJ, this->epsilon()) && m_loJ > R(-infinity))
         {
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_j] = m_loJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_upK + m_scale * m_upJ, this->epsilon()) && m_upK < R(infinity))
         {
            cStatus[m_k] = (m_loK == m_upK) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_k] = m_upK;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            x[m_j] = z2 * scale2 / m_scale;
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_upJ, this->epsilon()) && m_upJ < R(infinity))
         {
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_j] = m_upJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_upJ, this->epsilon()) && m_loK > R(-infinity))
         {
            cStatus[m_k] = (m_loK == m_upK) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_k] = m_loK;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            x[m_j] = z1 * scale1 / m_scale;
         }
         else if(LTrel(x[m_k], m_loK + m_scale * m_upJ, this->epsilon()))
         {
            assert(m_upJ < R(infinity));
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_j] = m_upJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else
         {
            throw SPxInternalCodeException("XMAISM09 This should never happen.");
         }
      }
   }

   // dual:
   r[m_j] = m_scale * r[m_k];
}